

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrAlgo.h
# Opt level: O0

char * __thiscall InplaceStr::rfind(InplaceStr *this,char ch)

{
  bool bVar1;
  InplaceStr *local_28;
  char *pos;
  char ch_local;
  InplaceStr *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    this_local = (InplaceStr *)0x0;
  }
  else {
    local_28 = (InplaceStr *)this->end;
    do {
      local_28 = (InplaceStr *)((long)&local_28[-1].end + 7);
      if (local_28 < (InplaceStr *)this->begin) {
        return (char *)0x0;
      }
    } while (*(char *)&local_28->begin != ch);
    this_local = local_28;
  }
  return (char *)this_local;
}

Assistant:

const char* rfind(char ch)
	{
		if(empty())
			return NULL;

		for(const char *pos = end - 1; pos >= begin; pos--)
		{
			if(*pos == ch)
				return pos;
		}

		return NULL;
	}